

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O0

int Saig_ManDupCompare(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  int Diff;
  Aig_Obj_t **pp2_local;
  Aig_Obj_t **pp1_local;
  
  iVar1 = Aig_ObjToLit(*pp1);
  iVar2 = Aig_ObjToLit(*pp2);
  if (iVar1 - iVar2 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 - iVar2 < 1) {
    pp1_local._4_4_ = 0;
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Saig_ManDupCompare( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjToLit(*pp1) - Aig_ObjToLit(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}